

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixelshuffle.cpp
# Opt level: O2

int __thiscall
ncnn::PixelShuffle::forward(PixelShuffle *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  int _c;
  ulong uVar9;
  undefined4 *puVar10;
  int iVar11;
  undefined4 *puVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 *puVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  undefined4 *puVar23;
  undefined4 *puVar24;
  undefined4 *local_98;
  
  iVar20 = bottom_blob->w;
  uVar1 = bottom_blob->h;
  iVar8 = this->upscale_factor;
  uVar22 = (long)bottom_blob->c / (long)(iVar8 * iVar8);
  _c = (int)uVar22;
  Mat::create(top_blob,iVar8 * iVar20,iVar8 * uVar1,_c,bottom_blob->elemsize,opt->blob_allocator);
  local_98 = (undefined4 *)top_blob->data;
  iVar8 = -100;
  if ((local_98 != (undefined4 *)0x0) && (sVar3 = top_blob->cstep, (long)top_blob->c * sVar3 != 0))
  {
    if (iVar20 < 1) {
      iVar20 = 0;
    }
    uVar21 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar21 = 0;
    }
    uVar1 = this->upscale_factor;
    if (this->upscale_factor < 1) {
      uVar1 = 0;
    }
    uVar22 = uVar22 & 0xffffffff;
    if (_c < 1) {
      uVar22 = 0;
    }
    sVar4 = top_blob->elemsize;
    lVar14 = (long)top_blob->w * sVar4;
    for (uVar15 = 0; uVar15 != uVar22; uVar15 = uVar15 + 1) {
      uVar2 = this->upscale_factor;
      uVar9 = 0;
      if (0 < (int)uVar2) {
        uVar9 = (ulong)uVar2;
      }
      puVar24 = local_98;
      for (uVar16 = 0; uVar16 != uVar1; uVar16 = uVar16 + 1) {
        iVar8 = this->mode;
        pvVar5 = bottom_blob->data;
        sVar6 = bottom_blob->cstep;
        sVar7 = bottom_blob->elemsize;
        puVar23 = puVar24;
        for (uVar19 = 0; uVar19 != uVar9; uVar19 = uVar19 + 1) {
          iVar11 = ((int)uVar16 * uVar2 + (int)uVar19) * _c + (int)uVar15;
          if (iVar8 == 0) {
            iVar11 = ((int)uVar16 + (int)uVar15 * uVar2) * uVar2 + (int)uVar19;
          }
          puVar12 = (undefined4 *)((long)iVar11 * sVar6 * sVar7 + (long)pvVar5);
          iVar11 = this->upscale_factor;
          puVar17 = puVar23;
          for (uVar18 = 0; puVar10 = puVar17, iVar13 = iVar20, uVar18 != uVar21; uVar18 = uVar18 + 1
              ) {
            while (iVar13 != 0) {
              *puVar10 = *puVar12;
              puVar12 = puVar12 + 1;
              puVar10 = puVar10 + iVar11;
              iVar13 = iVar13 + -1;
            }
            puVar17 = (undefined4 *)((long)puVar17 + lVar14 * iVar11);
          }
          puVar23 = puVar23 + 1;
        }
        puVar24 = (undefined4 *)((long)puVar24 + lVar14);
      }
      local_98 = (undefined4 *)((long)local_98 + sVar3 * sVar4);
    }
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int PixelShuffle::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w * upscale_factor;
    int outh = h * upscale_factor;
    int outc = channels / (upscale_factor * upscale_factor);

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outc; p++)
    {
        Mat m = top_blob.channel(p);

        for (int sh = 0; sh < upscale_factor; sh++)
        {
            for (int sw = 0; sw < upscale_factor; sw++)
            {
                int q;
                if (mode == 0)
                    q = p * upscale_factor * upscale_factor + sh * upscale_factor + sw;
                else // if (mode == 1)
                    q = (sh * upscale_factor + sw) * outc + p;

                const float* sptr = bottom_blob.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float* outptr = m.row(i * upscale_factor + sh) + sw;
                    for (int j = 0; j < w; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr++;
                        outptr += upscale_factor;
                    }
                }
            }
        }
    }

    return 0;
}